

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

int stumpless_trace_log_str
              (stumpless_target *target,int priority,char *file,int line,char *func,char *message)

{
  int iVar1;
  long lVar2;
  stumpless_entry *psVar3;
  stumpless_entry *psVar4;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
  }
  else {
    lVar2 = __tls_get_addr(&PTR_0011bfb0);
    psVar3 = (stumpless_entry *)(lVar2 + 0x270);
    if (*(char *)(lVar2 + 0x268) == '\0') {
      psVar4 = stumpless_load_entry_str
                         (psVar3,STUMPLESS_FACILITY_USER,STUMPLESS_SEVERITY_INFO,(char *)0x0,
                          (char *)0x0,message);
      if (psVar4 != (stumpless_entry *)0x0) {
        psVar4 = add_trace_element();
        if (psVar4 != (stumpless_entry *)0x0) {
          *(undefined1 *)(lVar2 + 0x268) = 1;
          goto LAB_00110423;
        }
        unchecked_unload_entry(psVar3);
      }
    }
    else {
      psVar3 = stumpless_set_entry_message_str(psVar3,message);
      if (psVar3 != (stumpless_entry *)0x0) {
LAB_00110423:
        *(int *)(lVar2 + 0x410) = priority;
        memcpy((void *)(lVar2 + 0x414),target->default_app_name,target->default_app_name_length);
        *(size_t *)(lVar2 + 0x448) = target->default_app_name_length;
        memcpy((void *)(lVar2 + 0x460),target->default_msgid,target->default_msgid_length);
        *(size_t *)(lVar2 + 0x488) = target->default_msgid_length;
        iVar1 = stumpless_trace_entry(target,(stumpless_entry *)(lVar2 + 0x270),file,line,func);
        return iVar1;
      }
    }
  }
  return -1;
}

Assistant:

int
stumpless_trace_log_str( struct stumpless_target *target,
                         int priority,
                         const char *file,
                         int line,
                         const char *func,
                         const char *message ) {
  const struct stumpless_entry *result;

  VALIDATE_ARG_NOT_NULL_INT_RETURN( target );

  if( unlikely( !cached_trace_valid ) ) {
    result = stumpless_load_entry_str( &cached_trace,
                                       STUMPLESS_FACILITY_USER,
                                       STUMPLESS_SEVERITY_INFO,
                                       NULL,
                                       NULL,
                                       message );
    if( unlikely( !result ) ) {
      return -1;
    }

    if( !add_trace_element(  ) ) {
      unchecked_unload_entry( &cached_trace );
      return -1;
    }

    cached_trace_valid = true;

  } else {
    result = stumpless_set_entry_message_str( &cached_trace,
                                              message );
    if( unlikely( !result ) ) {
      return -1;
    }
  }

  // we don't need to lock the cached entry since it is thread-local
  cached_trace.prival = priority;
  memcpy( cached_trace.app_name,
          target->default_app_name,
          target->default_app_name_length );
  cached_trace.app_name_length = target->default_app_name_length;
  memcpy( cached_trace.msgid,
          target->default_msgid,
          target->default_msgid_length );
  cached_trace.msgid_length = target->default_msgid_length;

  return stumpless_trace_entry( target, &cached_trace, file, line, func );
}